

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.cpp
# Opt level: O0

bool __thiscall mpt::encode_array::prepare(encode_array *this,size_t len)

{
  size_t len_00;
  void *pvVar1;
  size_t old;
  size_t len_local;
  encode_array *this_local;
  
  if (this->_enc == (data_encoder_t)0x0) {
    len_00 = array::length(&this->_d);
    pvVar1 = array::set(&this->_d,len_00 + len,(void *)0x0);
    if (pvVar1 == (void *)0x0) {
      this_local._7_1_ = false;
    }
    else {
      array::set(&this->_d,len_00,(void *)0x0);
      this_local._7_1_ = true;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool encode_array::prepare(size_t len)
{
	if (_enc) {
		return false;
	}
	size_t old = _d.length();
	if (!_d.set(old + len)) {
		return false;
	}
	_d.set(old);
	return true;
}